

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_bind_int64(sqlite3_stmt *pStmt,int i,sqlite_int64 iValue)

{
  long lVar1;
  int iVar2;
  long lVar3;
  
  iVar2 = vdbeUnbind((Vdbe *)pStmt,i);
  if (iVar2 == 0) {
    lVar1 = *(long *)(pStmt + 0x80);
    lVar3 = (long)i * 0x38;
    if ((*(byte *)(lVar1 + -0x2f + lVar3) & 0x24) == 0) {
      *(sqlite_int64 *)(lVar1 + lVar3 + -0x38) = iValue;
      *(undefined2 *)(lVar1 + lVar3 + -0x30) = 4;
    }
    else {
      vdbeReleaseAndSetInt64((Mem *)(lVar1 + lVar3 + -0x38),iValue);
    }
    if (*(sqlite3_mutex **)(*(long *)pStmt + 0x18) != (sqlite3_mutex *)0x0) {
      (*sqlite3Config.mutex.xMutexLeave)(*(sqlite3_mutex **)(*(long *)pStmt + 0x18));
    }
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_bind_int64(sqlite3_stmt *pStmt, int i, sqlite_int64 iValue){
  int rc;
  Vdbe *p = (Vdbe *)pStmt;
  rc = vdbeUnbind(p, i);
  if( rc==SQLITE_OK ){
    sqlite3VdbeMemSetInt64(&p->aVar[i-1], iValue);
    sqlite3_mutex_leave(p->db->mutex);
  }
  return rc;
}